

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O2

void duckdb::ModeFun::GetFunctions(void)

{
  long in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_1a9;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1a8;
  LogicalType local_190 [24];
  LogicalType local_178 [24];
  string local_160 [32];
  AggregateFunction local_140;
  
  std::__cxx11::string::string(local_160,"mode",(allocator *)&local_1a8);
  duckdb::AggregateFunctionSet::AggregateFunctionSet();
  std::__cxx11::string::~string(local_160);
  duckdb::LogicalType::LogicalType(local_178,ANY);
  __l._M_len = 1;
  __l._M_array = local_178;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_1a8,__l,&local_1a9);
  duckdb::LogicalType::LogicalType(local_190,ANY);
  AggregateFunction::AggregateFunction
            (&local_140,(vector<duckdb::LogicalType,_true> *)&local_1a8,local_190,
             (aggregate_size_t)0x0,(aggregate_initialize_t)0x0,(aggregate_update_t)0x0,
             (aggregate_combine_t)0x0,(aggregate_finalize_t)0x0,(aggregate_simple_update_t)0x0,
             BindModeAggregate,(aggregate_destructor_t)0x0,(aggregate_statistics_t)0x0,
             (aggregate_window_t)0x0,(aggregate_serialize_t)0x0,(aggregate_deserialize_t)0x0);
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            ((vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *)
             (in_RDI + 0x20),&local_140);
  AggregateFunction::~AggregateFunction(&local_140);
  duckdb::LogicalType::~LogicalType(local_190);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_1a8);
  duckdb::LogicalType::~LogicalType(local_178);
  return;
}

Assistant:

AggregateFunctionSet ModeFun::GetFunctions() {
	AggregateFunctionSet mode("mode");
	mode.AddFunction(AggregateFunction({LogicalTypeId::ANY}, LogicalTypeId::ANY, nullptr, nullptr, nullptr, nullptr,
	                                   nullptr, nullptr, BindModeAggregate));
	return mode;
}